

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

int32_t __thiscall
icu_63::DictionaryBreakEngine::findBreaks
          (DictionaryBreakEngine *this,UText *text,int32_t startPos,int32_t endPos,
          UVector32 *foundBreaks)

{
  UBool UVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  UChar32 local_40;
  UChar32 c;
  int32_t rangeEnd;
  int32_t rangeStart;
  int32_t current;
  int32_t start;
  int32_t result;
  UVector32 *foundBreaks_local;
  int32_t endPos_local;
  int32_t startPos_local;
  UText *text_local;
  DictionaryBreakEngine *this_local;
  
  uVar3 = utext_getNativeIndex_63(text);
  local_40 = utext_current32_63(text);
  while( true ) {
    uVar4 = utext_getNativeIndex_63(text);
    bVar5 = false;
    if ((int)uVar4 < endPos) {
      UVar1 = UnicodeSet::contains(&this->fSet,local_40);
      bVar5 = UVar1 != '\0';
    }
    if (!bVar5) break;
    utext_next32_63(text);
    local_40 = utext_current32_63(text);
  }
  iVar2 = (*(this->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[5])
                    (this,text,uVar3 & 0xffffffff,uVar4 & 0xffffffff,foundBreaks);
  utext_setNativeIndex_63(text,(long)(int)uVar4);
  return iVar2;
}

Assistant:

int32_t
DictionaryBreakEngine::findBreaks( UText *text,
                                 int32_t startPos,
                                 int32_t endPos,
                                 UVector32 &foundBreaks ) const {
    (void)startPos;            // TODO: remove this param?
    int32_t result = 0;

    // Find the span of characters included in the set.
    //   The span to break begins at the current position in the text, and
    //   extends towards the start or end of the text, depending on 'reverse'.

    int32_t start = (int32_t)utext_getNativeIndex(text);
    int32_t current;
    int32_t rangeStart;
    int32_t rangeEnd;
    UChar32 c = utext_current32(text);
    while((current = (int32_t)utext_getNativeIndex(text)) < endPos && fSet.contains(c)) {
        utext_next32(text);         // TODO:  recast loop for postincrement
        c = utext_current32(text);
    }
    rangeStart = start;
    rangeEnd = current;
    result = divideUpDictionaryRange(text, rangeStart, rangeEnd, foundBreaks);
    utext_setNativeIndex(text, current);
    
    return result;
}